

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_io.cpp
# Opt level: O3

shared_ptr<lume::Mesh> __thiscall lume::CreateMeshFromUGX(lume *this,string *filename)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Mesh *this_01;
  iterator __position;
  double dVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  xml_node<char> *pxVar6;
  xml_attribute<char> *pxVar7;
  xml_node<char> *this_02;
  xml_node<char> *pxVar8;
  FileParseError *pFVar9;
  FileNotFoundError *this_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ulong uVar10;
  long lVar11;
  undefined1 auVar12 [16];
  shared_ptr<lume::Mesh> sVar13;
  shared_ptr<lume::Mesh> *mesh;
  string siName;
  SPSubsetInfoAnnex subsetInfo;
  ifstream in;
  xml_document<char> doc;
  uint uStack_1032c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_10320;
  int iStack_102fc;
  ulong uStack_102f8;
  real_t arStack_102f0 [4];
  SubsetInfoAnnex *pSStack_102e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_102d8;
  string *psStack_102d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_102c8;
  undefined1 auStack_102c0 [32];
  ulong uStack_102a0;
  real_t arStack_10298 [2];
  bool bStack_10290;
  xml_document<char> xStack_100b8;
  
  xStack_100b8.super_xml_node<char>.super_xml_base<char>.m_parent = (xml_node<char> *)0x0;
  xStack_100b8.super_xml_node<char>.super_xml_base<char>.m_name = (char *)0x0;
  xStack_100b8.super_xml_node<char>.super_xml_base<char>.m_value = (char *)0x0;
  xStack_100b8.super_xml_node<char>.m_type = node_document;
  xStack_100b8.super_xml_node<char>.m_first_node = (xml_node<char> *)0x0;
  xStack_100b8.super_xml_node<char>.m_first_attribute = (xml_attribute<char> *)0x0;
  xStack_100b8.super_memory_pool<char>.m_end =
       (char *)&xStack_100b8.super_memory_pool<char>.m_alloc_func;
  xStack_100b8.super_memory_pool<char>.m_begin =
       xStack_100b8.super_memory_pool<char>.m_static_memory;
  xStack_100b8.super_memory_pool<char>.m_alloc_func = (alloc_func *)0x0;
  xStack_100b8.super_memory_pool<char>.m_free_func = (free_func *)0x0;
  xStack_100b8.super_memory_pool<char>.m_ptr = xStack_100b8.super_memory_pool<char>.m_begin;
  std::ifstream::ifstream(auStack_102c0,(string *)filename,_S_bin);
  if ((*(byte *)((long)&uStack_102a0 +
                (long)(((vector<lume::SubsetInfoAnnex::SubsetProperties,_std::allocator<lume::SubsetInfoAnnex::SubsetProperties>_>
                         *)(auStack_102c0._0_8_ + -0x18))->
                      super__Vector_base<lume::SubsetInfoAnnex::SubsetProperties,_std::allocator<lume::SubsetInfoAnnex::SubsetProperties>_>
                      )._M_impl.super__Vector_impl_data._M_start) & 5) != 0) {
    this_03 = (FileNotFoundError *)__cxa_allocate_exception(0x70);
    FileNotFoundError::FileNotFoundError(this_03,filename);
    __cxa_throw(this_03,&FileNotFoundError::typeinfo,FileNotFoundError::~FileNotFoundError);
  }
  auVar12 = std::istream::tellg();
  std::istream::seekg((long)auStack_102c0,_S_beg);
  lVar4 = std::istream::tellg();
  std::istream::seekg(auStack_102c0,auVar12._0_8_,auVar12._8_8_);
  lVar4 = lVar4 - auVar12._0_8_;
  pcVar5 = rapidxml::memory_pool<char>::allocate_string
                     (&xStack_100b8.super_memory_pool<char>,(char *)0x0,lVar4 + 1);
  std::istream::read(auStack_102c0,(long)pcVar5);
  pcVar5[lVar4] = '\0';
  std::ifstream::close();
  std::ifstream::~ifstream(auStack_102c0);
  rapidxml::xml_document<char>::parse<0>(&xStack_100b8,pcVar5);
  pxVar6 = rapidxml::xml_node<char>::first_node(&xStack_100b8.super_xml_node<char>,"grid",0,true);
  if (pxVar6 == (xml_node<char> *)0x0) {
    pFVar9 = (FileParseError *)__cxa_allocate_exception(0x70);
    bStack_10320._M_dataplus._M_p = (pointer)&bStack_10320.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&bStack_10320,"no grid found in ","");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   auStack_102c0,&bStack_10320,filename);
    FileParseError::FileParseError(pFVar9,(string *)auStack_102c0);
    __cxa_throw(pFVar9,&FileParseError::typeinfo,FileParseError::~FileParseError);
  }
  *(undefined8 *)this = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<lume::Mesh,std::allocator<lume::Mesh>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 8),(Mesh **)this,
             (allocator<lume::Mesh> *)auStack_102c0);
  lVar4 = **(long **)this;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(*(long **)this)[1];
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pxVar6 = pxVar6->m_first_node;
  psStack_102d0 = filename;
  if (pxVar6 != (xml_node<char> *)0x0) {
    iStack_102fc = -1;
    do {
      pcVar5 = (pxVar6->super_xml_base<char>).m_name;
      if (pcVar5 == (char *)0x0) {
        pcVar5 = &rapidxml::xml_base<char>::nullstr()::zero;
      }
      iVar2 = strcmp(pcVar5,"vertices");
      if ((iVar2 == 0) || (iVar2 = strcmp(pcVar5,"constrained_vertices"), iVar2 == 0)) {
        pxVar7 = rapidxml::xml_node<char>::first_attribute(pxVar6,"coords",0,true);
        if (pxVar7 == (xml_attribute<char> *)0x0) {
LAB_00199f02:
          pFVar9 = (FileParseError *)__cxa_allocate_exception(0x70);
          bStack_10320._M_dataplus._M_p = (pointer)&bStack_10320.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&bStack_10320,"Not enough coordinates provided in ","");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         auStack_102c0,&bStack_10320,psStack_102d0);
          FileParseError::FileParseError(pFVar9,(string *)auStack_102c0);
          __cxa_throw(pFVar9,&FileParseError::typeinfo,FileParseError::~FileParseError);
        }
        pcVar5 = (pxVar7->super_xml_base<char>).m_value;
        if (pcVar5 == (char *)0x0) {
          pcVar5 = &rapidxml::xml_base<char>::nullstr()::zero;
        }
        iVar2 = atoi(pcVar5);
        if (iVar2 < 1) goto LAB_00199f02;
        if (iStack_102fc != iVar2 && -1 < iStack_102fc) {
          pFVar9 = (FileParseError *)__cxa_allocate_exception(0x70);
          bStack_10320._M_dataplus._M_p = (pointer)&bStack_10320.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&bStack_10320,
                     "Can\'t read vertices with differing numbers of coordinates from ","");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         auStack_102c0,&bStack_10320,psStack_102d0);
          FileParseError::FileParseError(pFVar9,(string *)auStack_102c0);
          __cxa_throw(pFVar9,&FileParseError::typeinfo,FileParseError::~FileParseError);
        }
        *(int *)(lVar4 + 0x20) = iVar2;
        pcVar5 = (pxVar6->super_xml_base<char>).m_value;
        if (pcVar5 == (char *)0x0) {
          pcVar5 = &rapidxml::xml_base<char>::nullstr()::zero;
        }
        pcVar5 = strtok(pcVar5," ");
        if (pcVar5 != (char *)0x0) {
          do {
            dVar1 = atof(pcVar5);
            auStack_102c0._0_4_ = (float)dVar1;
            __position._M_current = *(float **)(lVar4 + 0x10);
            if (__position._M_current == *(float **)(lVar4 + 0x18)) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)(lVar4 + 8),__position,
                         (float *)auStack_102c0);
            }
            else {
              *__position._M_current = (float)dVar1;
              *(float **)(lVar4 + 0x10) = __position._M_current + 1;
            }
            pcVar5 = strtok((char *)0x0," ");
          } while (pcVar5 != (char *)0x0);
        }
      }
      else {
        iVar2 = strcmp(pcVar5,"edges");
        lVar11 = 0x18;
        if (((iVar2 != 0) && (iVar2 = strcmp(pcVar5,"constraining_edges"), iVar2 != 0)) &&
           (iVar2 = strcmp(pcVar5,"constrained_edges"), iVar2 != 0)) {
          iVar2 = strcmp(pcVar5,"triangles");
          lVar11 = 0x20;
          if (((iVar2 != 0) && (iVar2 = strcmp(pcVar5,"constraining_triangles"), iVar2 != 0)) &&
             (iVar2 = strcmp(pcVar5,"constrained_triangles"), iVar2 != 0)) {
            iVar2 = strcmp(pcVar5,"quadrilaterals");
            lVar11 = 0x28;
            if (((iVar2 != 0) && (iVar2 = strcmp(pcVar5,"constraining_quadrilaterals"), iVar2 != 0))
               && (iVar2 = strcmp(pcVar5,"constrained_quadrilaterals"), iVar2 != 0)) {
              iVar2 = strcmp(pcVar5,"tetrahedrons");
              if (iVar2 == 0) {
                lVar11 = 0x30;
              }
              else {
                iVar2 = strcmp(pcVar5,"hexahedrons");
                if (iVar2 == 0) {
                  lVar11 = 0x38;
                }
                else {
                  iVar2 = strcmp(pcVar5,"pyramids");
                  if (iVar2 == 0) {
                    lVar11 = 0x40;
                  }
                  else {
                    iVar2 = strcmp(pcVar5,"prisms");
                    if (iVar2 != 0) {
                      iVar3 = strcmp(pcVar5,"subset_handler");
                      iVar2 = iStack_102fc;
                      if (iVar3 == 0) {
                        impl::GenerateVertexIndicesFromCoords(*(Mesh **)this);
                        bStack_10320._M_dataplus._M_p = (pointer)&bStack_10320.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&bStack_10320,"subsetHandler","");
                        pxVar7 = rapidxml::xml_node<char>::first_attribute(pxVar6,"name",0,true);
                        if (pxVar7 != (xml_attribute<char> *)0x0) {
                          pcVar5 = (pxVar7->super_xml_base<char>).m_value;
                          if (pcVar5 == (char *)0x0) {
                            pcVar5 = &rapidxml::xml_base<char>::nullstr()::zero;
                          }
                          std::__cxx11::string::operator=((string *)&bStack_10320,pcVar5);
                        }
                        pSStack_102e0 = (SubsetInfoAnnex *)0x0;
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                        __shared_count<lume::SubsetInfoAnnex,std::allocator<lume::SubsetInfoAnnex>,std::__cxx11::string&>
                                  (&_Stack_102d8,&pSStack_102e0,
                                   (allocator<lume::SubsetInfoAnnex> *)auStack_102c0,&bStack_10320);
                        auStack_102c0._16_8_ = 0x746c75616665645f;
                        auStack_102c0[0x18] = '_';
                        auStack_102c0._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x9;
                        auStack_102c0[0x19] = '\0';
                        uStack_102a0 = 0x3f8000003f800000;
                        arStack_10298[0] = 1.0;
                        arStack_10298[1] = 1.0;
                        bStack_10290 = true;
                        auStack_102c0._0_8_ = auStack_102c0 + 0x10;
                        SubsetInfoAnnex::add_subset(pSStack_102e0,(SubsetProperties *)auStack_102c0)
                        ;
                        if ((undefined1 *)auStack_102c0._0_8_ != auStack_102c0 + 0x10) {
                          operator_delete((void *)auStack_102c0._0_8_,auStack_102c0._16_8_ + 1);
                        }
                        this_02 = rapidxml::xml_node<char>::first_node(pxVar6,"subset",0,true);
                        if (this_02 != (xml_node<char> *)0x0) {
                          uStack_1032c = 1;
                          do {
                            auStack_102c0._0_8_ = auStack_102c0 + 0x10;
                            auStack_102c0._16_8_ = 0x746c75616665645f;
                            auStack_102c0[0x18] = '_';
                            auStack_102c0._8_8_ =
                                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x9;
                            auStack_102c0[0x19] = '\0';
                            uStack_102a0 = 0x3f8000003f800000;
                            arStack_10298[0] = 1.0;
                            arStack_10298[1] = 1.0;
                            bStack_10290 = true;
                            pxVar7 = rapidxml::xml_node<char>::first_attribute
                                               (this_02,"name",0,true);
                            if (pxVar7 != (xml_attribute<char> *)0x0) {
                              pcVar5 = (pxVar7->super_xml_base<char>).m_value;
                              if (pcVar5 == (char *)0x0) {
                                pcVar5 = &rapidxml::xml_base<char>::nullstr()::zero;
                              }
                              p_Stack_102c8 =
                                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                   auStack_102c0._8_8_;
                              strlen(pcVar5);
                              std::__cxx11::string::_M_replace
                                        ((ulong)auStack_102c0,0,(char *)p_Stack_102c8,(ulong)pcVar5)
                              ;
                            }
                            pxVar7 = rapidxml::xml_node<char>::first_attribute
                                               (this_02,"color",0,true);
                            if (pxVar7 != (xml_attribute<char> *)0x0) {
                              pcVar5 = (pxVar7->super_xml_base<char>).m_value;
                              if (pcVar5 == (char *)0x0) {
                                pcVar5 = &rapidxml::xml_base<char>::nullstr()::zero;
                              }
                              pcVar5 = strtok(pcVar5," ");
                              uStack_102f8 = 0x3f8000003f800000;
                              arStack_102f0[0] = 1.0;
                              arStack_102f0[1] = 1.0;
                              if (pcVar5 != (char *)0x0) {
                                uVar10 = 0;
                                do {
                                  dVar1 = atof(pcVar5);
                                  *(float *)((long)&uStack_102f8 + uVar10 * 4) = (float)dVar1;
                                  pcVar5 = strtok((char *)0x0," ");
                                  if (2 < uVar10) break;
                                  uVar10 = uVar10 + 1;
                                } while (pcVar5 != (char *)0x0);
                              }
                              uStack_102a0 = uStack_102f8;
                              arStack_10298[0] = arStack_102f0[0];
                              arStack_10298[1] = arStack_102f0[1];
                            }
                            pxVar8 = rapidxml::xml_node<char>::first_node(this_02,"vertices",0,true)
                            ;
                            uStack_102f8 = uStack_102f8 & 0xffffffff00000000;
                            ParseElementIndicesToArrayAnnex<unsigned_int>
                                      ((SPMesh *)this,&bStack_10320,pxVar8,uStack_1032c,
                                       (GrobSet *)&uStack_102f8);
                            pxVar8 = rapidxml::xml_node<char>::first_node(this_02,"edges",0,true);
                            uStack_102f8._0_4_ = 4;
                            ParseElementIndicesToArrayAnnex<unsigned_int>
                                      ((SPMesh *)this,&bStack_10320,pxVar8,uStack_1032c,
                                       (GrobSet *)&uStack_102f8);
                            pxVar8 = rapidxml::xml_node<char>::first_node(this_02,"faces",0,true);
                            uStack_102f8._0_4_ = 0x34;
                            ParseElementIndicesToArrayAnnex<unsigned_int>
                                      ((SPMesh *)this,&bStack_10320,pxVar8,uStack_1032c,
                                       (GrobSet *)&uStack_102f8);
                            pxVar8 = rapidxml::xml_node<char>::first_node(this_02,"volumes",0,true);
                            uStack_102f8 = CONCAT44(uStack_102f8._4_4_,0x3b);
                            ParseElementIndicesToArrayAnnex<unsigned_int>
                                      ((SPMesh *)this,&bStack_10320,pxVar8,uStack_1032c,
                                       (GrobSet *)&uStack_102f8);
                            SubsetInfoAnnex::add_subset
                                      (pSStack_102e0,(SubsetProperties *)auStack_102c0);
                            if ((SubsetInfoAnnex *)auStack_102c0._0_8_ !=
                                (SubsetInfoAnnex *)(auStack_102c0 + 0x10)) {
                              operator_delete((void *)auStack_102c0._0_8_,auStack_102c0._16_8_ + 1);
                            }
                            if ((this_02->super_xml_base<char>).m_parent == (xml_node<char> *)0x0)
                            goto LAB_00199f70;
                            this_02 = this_02->m_next_sibling;
                            uStack_1032c = uStack_1032c + 1;
                          } while (this_02 != (xml_node<char> *)0x0);
                        }
                        this_01 = *(Mesh **)this;
                        auStack_102c0._0_8_ = pSStack_102e0;
                        auStack_102c0._8_8_ = _Stack_102d8._M_pi;
                        if (_Stack_102d8._M_pi !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          if (__libc_single_threaded == '\0') {
                            LOCK();
                            (_Stack_102d8._M_pi)->_M_use_count =
                                 (_Stack_102d8._M_pi)->_M_use_count + 1;
                            UNLOCK();
                          }
                          else {
                            (_Stack_102d8._M_pi)->_M_use_count =
                                 (_Stack_102d8._M_pi)->_M_use_count + 1;
                          }
                        }
                        Mesh::set_annex(this_01,&bStack_10320,NO_GROB,(SPAnnex *)auStack_102c0);
                        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_102c0._8_8_ !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                     auStack_102c0._8_8_);
                        }
                        if (_Stack_102d8._M_pi !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    (_Stack_102d8._M_pi);
                        }
                        iVar2 = iStack_102fc;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)bStack_10320._M_dataplus._M_p != &bStack_10320.field_2) {
                          operator_delete(bStack_10320._M_dataplus._M_p,
                                          bStack_10320.field_2._M_allocated_capacity + 1);
                          iVar2 = iStack_102fc;
                        }
                      }
                      goto LAB_00199e70;
                    }
                    lVar11 = 0x48;
                  }
                }
              }
            }
          }
        }
        ReadIndicesToArrayAnnex
                  ((IndexArrayAnnex *)(*(long *)(*(long *)this + lVar11) + 8),
                   (xml_node<char> *)(pxVar6->super_xml_base<char>).m_value);
        iVar2 = iStack_102fc;
      }
LAB_00199e70:
      iStack_102fc = iVar2;
      if ((pxVar6->super_xml_base<char>).m_parent == (xml_node<char> *)0x0) {
LAB_00199f70:
        __assert_fail("this->m_parent",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/lume/deps/rapidxml-1.13/rapidxml/rapidxml.hpp"
                      ,0x3ee,
                      "xml_node<Ch> *rapidxml::xml_node<>::next_sibling(const Ch *, std::size_t, bool) const [Ch = char]"
                     );
      }
      pxVar6 = pxVar6->m_next_sibling;
    } while (pxVar6 != (xml_node<char> *)0x0);
  }
  rapidxml::memory_pool<char>::clear(&xStack_100b8.super_memory_pool<char>);
  sVar13.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar13.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<lume::Mesh>)sVar13.super___shared_ptr<lume::Mesh,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr <Mesh> CreateMeshFromUGX (std::string filename)
{
	xml_document<> doc;
	char* fileContent = nullptr;

	{
		ifstream in(filename, ios::binary);
		if (!in)
			throw FileNotFoundError (filename);

	//	get the length of the file
		streampos posStart = in.tellg();
		in.seekg(0, ios_base::end);
		streampos posEnd = in.tellg();
		streamsize size = posEnd - posStart;

	//	go back to the start of the file
		in.seekg(posStart);

	//	read the whole file en-block and terminate it with 0
		fileContent = doc.allocate_string(0, size + 1);
		in.read(fileContent, size);
		fileContent[size] = 0;
		in.close();
	}

	doc.parse<0>(fileContent);

	xml_node<>* gridNode = doc.first_node("grid");
	if (!gridNode)
		throw FileParseError (string ("no grid found in ") + filename);

	auto mesh = make_shared <Mesh> ();
	auto& coords = *mesh->coords();

	int lastNumSrcCoords = -1;
	xml_node<>* curNode = gridNode->first_node();
	for(;curNode; curNode = curNode->next_sibling()) {
		const char* name = curNode->name();

		if(strcmp(name, "vertices") == 0 || strcmp(name, "constrained_vertices") == 0)
		{
			int numSrcCoords = -1;
			xml_attribute<>* attrib = curNode->first_attribute("coords");
			if(attrib)
				numSrcCoords = atoi(attrib->value());

			if (numSrcCoords < 1)
				throw FileParseError (string ("Not enough coordinates provided in ") + filename);

			if (lastNumSrcCoords >= 0 && lastNumSrcCoords != numSrcCoords)
				throw FileParseError (string ("Can't read vertices with differing numbers "
			            "of coordinates from ") + filename);

			lastNumSrcCoords = numSrcCoords;
			coords.set_tuple_size (numSrcCoords);
			
		//	create a buffer with which we can access the data
			char* p = strtok (curNode->value(), " ");
			while (p) {
			//	read the data
				coords.push_back (real_t (atof(p)));
				p = strtok (nullptr, " ");
			}
		}

		else if(strcmp(name, "edges") == 0
		        || strcmp(name, "constraining_edges") == 0
		        || strcmp(name, "constrained_edges") == 0)
		{
			ReadIndicesToArrayAnnex (mesh->grobs (EDGE).underlying_array (), curNode);
		}

		else if(strcmp(name, "triangles") == 0
		        || strcmp(name, "constraining_triangles") == 0
		        || strcmp(name, "constrained_triangles") == 0)
		{
			ReadIndicesToArrayAnnex (mesh->grobs (TRI).underlying_array (), curNode);
		}

		else if(strcmp(name, "quadrilaterals") == 0
		        || strcmp(name, "constraining_quadrilaterals") == 0
		        || strcmp(name, "constrained_quadrilaterals") == 0)
		{
			ReadIndicesToArrayAnnex (mesh->grobs (QUAD).underlying_array (), curNode);
		}

		else if(strcmp(name, "tetrahedrons") == 0)
			ReadIndicesToArrayAnnex (mesh->grobs (TET).underlying_array (), curNode);

		else if(strcmp(name, "hexahedrons") == 0)
			ReadIndicesToArrayAnnex (mesh->grobs (HEX).underlying_array (), curNode);

		else if(strcmp(name, "pyramids") == 0)
			ReadIndicesToArrayAnnex (mesh->grobs (PYRA).underlying_array (), curNode);

		else if(strcmp(name, "prisms") == 0)
			ReadIndicesToArrayAnnex (mesh->grobs (PRISM).underlying_array (), curNode);

		// else if(strcmp(name, "octahedrons") == 0)
		// 	bSuccess = create_octahedrons(volumes, grid, curNode, vertices);

		else if(strcmp(name, "subset_handler") == 0) {
		//	make sure that vertex indices are present
			impl::GenerateVertexIndicesFromCoords (*mesh);

			string siName = "subsetHandler";
			if (xml_attribute<>* attrib = curNode->first_attribute("name"))
				siName = attrib->value();

			SPSubsetInfoAnnex subsetInfo = make_shared <SubsetInfoAnnex> (siName);
			subsetInfo->add_subset (SubsetInfoAnnex::SubsetProperties ());

			xml_node<>* subsetNode = curNode->first_node("subset");
			index_t subsetIndex = 1;
			for(;subsetNode; subsetNode = subsetNode->next_sibling()) {
				SubsetInfoAnnex::SubsetProperties props;
				if (xml_attribute<>* attrib = subsetNode->first_attribute("name"))
					props.name = attrib->value();
				if (xml_attribute<>* attrib = subsetNode->first_attribute("color"))
					props.color = ParseColor (attrib->value());

				ParseElementIndicesToArrayAnnex (mesh, siName, subsetNode, subsetIndex);

				subsetInfo->add_subset (std::move (props));
				++subsetIndex;
			}

			mesh->set_annex (siName, NO_GROB, subsetInfo);
		}

		// else if(strcmp(name, "vertex_attachment") == 0)
		// 	bSuccess = read_attachment<Vertex>(grid, curNode);
		// else if(strcmp(name, "edge_attachment") == 0)
		// 	bSuccess = read_attachment<Edge>(grid, curNode);
		// else if(strcmp(name, "face_attachment") == 0)
		// 	bSuccess = read_attachment<Face>(grid, curNode);
		// else if(strcmp(name, "volume_attachment") == 0)
		// 	bSuccess = read_attachment<Volume>(grid, curNode);
	}

	return mesh;
}